

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall perfetto::TracingSession::FlushBlocking(TracingSession *this,uint32_t timeout_ms)

{
  bool bVar1;
  anon_class_16_2_62152ee1 local_a8;
  function<void_(bool)> local_98;
  undefined1 local_78 [8];
  WaitableEvent flush_ack;
  atomic<bool> flush_result;
  uint32_t timeout_ms_local;
  TracingSession *this_local;
  
  flush_ack._92_4_ = timeout_ms;
  perfetto::base::WaitableEvent::WaitableEvent((WaitableEvent *)local_78);
  local_a8.flush_result = (atomic<bool> *)&flush_ack.field_0x5b;
  local_a8.flush_ack = (WaitableEvent *)local_78;
  ::std::function<void(bool)>::
  function<perfetto::TracingSession::FlushBlocking(unsigned_int)::__0,void>
            ((function<void(bool)> *)&local_98,&local_a8);
  (*this->_vptr_TracingSession[7])(this,&local_98,(ulong)(uint)flush_ack._92_4_);
  std::function<void_(bool)>::~function(&local_98);
  perfetto::base::WaitableEvent::Wait((WaitableEvent *)local_78);
  bVar1 = ::std::atomic::operator_cast_to_bool((atomic *)&flush_ack.field_0x5b);
  perfetto::base::WaitableEvent::~WaitableEvent((WaitableEvent *)local_78);
  return bVar1;
}

Assistant:

bool TracingSession::FlushBlocking(uint32_t timeout_ms) {
  std::atomic<bool> flush_result;
  base::WaitableEvent flush_ack;

  // The non blocking Flush() can be called on any thread. It does the PostTask
  // internally.
  Flush(
      [&flush_ack, &flush_result](bool res) {
        flush_result = res;
        flush_ack.Notify();
      },
      timeout_ms);
  flush_ack.Wait();
  return flush_result;
}